

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filenames.cc
# Opt level: O2

void __thiscall filenames_GetBasename_Test::TestBody(filenames_GetBasename_Test *this)

{
  undefined1 auVar1 [16];
  size_type in_RCX;
  size_type in_RDX;
  string_view sVar2;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view filename_05;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view sv_04;
  string_view sv_05;
  string_view sv_06;
  string_view sv_07;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type extraout_RDX_04;
  size_type extraout_RDX_05;
  ulong extraout_RDX_06;
  
  sVar2.size_ = in_RDX;
  sVar2.data_ = (char *)0x10;
  sVar2 = wabt::GetBasename((wabt *)"/bar/dir/foo.txt",sVar2);
  sv.data_ = (char *)sVar2.size_;
  sv.size_ = in_RCX;
  anon_unknown.dwarf_bd31f::assert_string_view_eq
            ((anon_unknown_dwarf_bd31f *)0x27e36a,sVar2.data_,sv);
  filename.size_ = extraout_RDX;
  filename.data_ = (char *)0xf;
  sVar2 = wabt::GetBasename((wabt *)0x27e362,filename);
  sv_00.data_ = (char *)sVar2.size_;
  sv_00.size_ = in_RCX;
  anon_unknown.dwarf_bd31f::assert_string_view_eq
            ((anon_unknown_dwarf_bd31f *)0x27e36a,sVar2.data_,sv_00);
  filename_00.size_ = extraout_RDX_00;
  filename_00.data_ = (char *)0x8;
  sVar2 = wabt::GetBasename((wabt *)0x27e369,filename_00);
  sv_01.data_ = (char *)sVar2.size_;
  sv_01.size_ = in_RCX;
  anon_unknown.dwarf_bd31f::assert_string_view_eq
            ((anon_unknown_dwarf_bd31f *)0x27e36a,sVar2.data_,sv_01);
  filename_01.size_ = extraout_RDX_01;
  filename_01.data_ = (char *)0x10;
  sVar2 = wabt::GetBasename((wabt *)"\\bar\\dir\\foo.txt",filename_01);
  sv_02.data_ = (char *)sVar2.size_;
  sv_02.size_ = in_RCX;
  anon_unknown.dwarf_bd31f::assert_string_view_eq
            ((anon_unknown_dwarf_bd31f *)0x27e36a,sVar2.data_,sv_02);
  filename_02.size_ = extraout_RDX_02;
  filename_02.data_ = (char *)0xf;
  sVar2 = wabt::GetBasename((wabt *)0x27e373,filename_02);
  sv_03.data_ = (char *)sVar2.size_;
  sv_03.size_ = in_RCX;
  anon_unknown.dwarf_bd31f::assert_string_view_eq
            ((anon_unknown_dwarf_bd31f *)0x27e36a,sVar2.data_,sv_03);
  filename_03.size_ = extraout_RDX_03;
  filename_03.data_ = (char *)0x8;
  sVar2 = wabt::GetBasename((wabt *)0x27e37a,filename_03);
  sv_04.data_ = (char *)sVar2.size_;
  sv_04.size_ = in_RCX;
  anon_unknown.dwarf_bd31f::assert_string_view_eq
            ((anon_unknown_dwarf_bd31f *)0x27e36a,sVar2.data_,sv_04);
  filename_04.size_ = extraout_RDX_04;
  filename_04.data_ = (char *)0x7;
  sVar2 = wabt::GetBasename((wabt *)0x27e36a,filename_04);
  sv_05.data_ = (char *)sVar2.size_;
  sv_05.size_ = in_RCX;
  anon_unknown.dwarf_bd31f::assert_string_view_eq
            ((anon_unknown_dwarf_bd31f *)0x27e36a,sVar2.data_,sv_05);
  filename_05.size_ = extraout_RDX_05;
  filename_05.data_ = (char *)0x3;
  sVar2 = wabt::GetBasename((wabt *)0x28b1a3,filename_05);
  sv_06.data_ = (char *)sVar2.size_;
  sv_06.size_ = in_RCX;
  anon_unknown.dwarf_bd31f::assert_string_view_eq
            ((anon_unknown_dwarf_bd31f *)0x28b1a3,sVar2.data_,sv_06);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = extraout_RDX_06;
  sVar2 = wabt::GetBasename((wabt *)0x280721,(string_view)(auVar1 << 0x40));
  sv_07.data_ = (char *)sVar2.size_;
  sv_07.size_ = in_RCX;
  anon_unknown.dwarf_bd31f::assert_string_view_eq
            ((anon_unknown_dwarf_bd31f *)0x280721,sVar2.data_,sv_07);
  return;
}

Assistant:

TEST(filenames, GetBasename) {
  assert_string_view_eq("foo.txt", GetBasename("/bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("foo.txt"));
  assert_string_view_eq("foo", GetBasename("foo"));
  assert_string_view_eq("", GetBasename(""));
}